

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O1

void __thiscall
duckdb::BoxRenderer::RenderRowCount
          (BoxRenderer *this,string *row_count_str,string *shown_str,string *column_count_str,
          vector<unsigned_long,_true> *boundaries,bool has_hidden_rows,bool has_hidden_columns,
          idx_t total_length,idx_t row_count,idx_t column_count,idx_t minimum_row_length,
          BaseResultRenderer *ss)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  byte bVar3;
  const_reference pvVar4;
  char cVar5;
  long lVar6;
  value_type vVar7;
  undefined7 in_register_00000089;
  size_type __n;
  ulong uVar8;
  string *unaff_R15;
  undefined7 uVar9;
  allocator local_8b;
  byte local_8a;
  char local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  int local_64;
  string *local_60;
  BoxRenderer *local_58;
  uint local_4c;
  string *local_48;
  string *local_40;
  long local_38;
  
  local_64 = (int)CONCAT71(in_register_00000089,has_hidden_rows);
  local_60 = shown_str;
  if ((local_64 != 0) &&
     (shown_str->_M_string_length + row_count_str->_M_string_length + 5 <= total_length)) {
    ::std::operator+(&local_88," ",shown_str);
    ::std::__cxx11::string::_M_append((char *)row_count_str,(ulong)local_88._M_dataplus._M_p);
    paVar1 = &local_88.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    local_88._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::operator=((string *)local_60,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    minimum_row_length = row_count_str->_M_string_length + 4;
    local_64 = 0;
    unaff_R15 = row_count_str;
  }
  if (total_length < row_count_str->_M_string_length + column_count_str->_M_string_length + 6) {
    uVar8 = 0;
  }
  else {
    uVar9 = (undefined7)((ulong)unaff_R15 >> 8);
    uVar8 = CONCAT71(uVar9,1);
    if (!has_hidden_columns || row_count == 0) {
      uVar8 = CONCAT71(uVar9,1 < column_count && 9 < row_count);
    }
  }
  cVar5 = row_count - 10 < 0xfffffffffffffff7 && minimum_row_length <= total_length;
  bVar3 = cVar5 | (byte)uVar8;
  local_48 = row_count_str;
  local_40 = column_count_str;
  if (row_count != 0) {
    local_38 = (ulong)bVar3 * 0x20;
    local_8a = bVar3;
    local_89 = cVar5;
    ::std::__cxx11::string::string
              ((string *)&local_88,(&(this->config).LDCORNER)[(ulong)bVar3 * 4],&local_8b);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_88);
    local_4c = (uint)uVar8;
    local_58 = this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if (total_length != 2) {
      vVar7 = 0;
      __n = 0;
      do {
        uVar8 = __n + 1;
        if ((uVar8 < (ulong)((long)(boundaries->
                                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(boundaries->
                                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3)) &&
           (pvVar4 = vector<unsigned_long,_true>::operator[](boundaries,__n), vVar7 == *pvVar4)) {
          ::std::__cxx11::string::string((string *)&local_88,(local_58->config).DMIDDLE,&local_8b);
          (*ss->_vptr_BaseResultRenderer[2])(ss,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)&local_88,(local_58->config).HORIZONTAL,&local_8b);
          (*ss->_vptr_BaseResultRenderer[2])(ss,&local_88);
          uVar8 = __n;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
        }
        vVar7 = vVar7 + 1;
        __n = uVar8;
      } while (total_length - 2 != vVar7);
    }
    this = local_58;
    ::std::__cxx11::string::string
              ((string *)&local_88,*(char **)((long)&(local_58->config).RDCORNER + local_38),
               &local_8b);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_88);
    uVar8 = (ulong)local_4c;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    BaseResultRenderer::operator<<(ss,'\n');
    cVar5 = local_89;
    bVar3 = local_8a;
  }
  if (bVar3 == 0) {
    return;
  }
  if ((char)uVar8 == '\0') {
    if (cVar5 == '\0') goto LAB_00e66d5a;
    RenderValue(this,ss,local_48,total_length - 4,FOOTER,MIDDLE);
    ::std::__cxx11::string::string((string *)&local_88,(this->config).VERTICAL,&local_8b);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    BaseResultRenderer::operator<<(ss,'\n');
    if ((char)local_64 == '\0') goto LAB_00e66d5a;
    RenderValue(this,ss,local_60,total_length - 4,FOOTER,MIDDLE);
    ::std::__cxx11::string::string((string *)&local_88,(this->config).VERTICAL,&local_8b);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) goto LAB_00e66c76;
  }
  else {
    ::std::__cxx11::string::string((string *)&local_88,(this->config).VERTICAL,&local_8b);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_88);
    paVar1 = &local_88.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    local_88._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88," ","");
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    psVar2 = local_48;
    (*ss->_vptr_BaseResultRenderer[7])(ss,local_48);
    local_88._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct
              ((ulong)&local_88,
               ((char)total_length -
               ((char)psVar2->_M_string_length + (char)local_40->_M_string_length)) + -4);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    (*ss->_vptr_BaseResultRenderer[7])(ss,local_40);
    local_88._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88," ","");
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    ::std::__cxx11::string::string((string *)&local_88,(this->config).VERTICAL,&local_8b);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
LAB_00e66c76:
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  BaseResultRenderer::operator<<(ss,'\n');
LAB_00e66d5a:
  ::std::__cxx11::string::string((string *)&local_88,(this->config).LDCORNER,&local_8b);
  (*ss->_vptr_BaseResultRenderer[2])(ss,&local_88);
  paVar1 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  lVar6 = total_length - 2;
  if (lVar6 != 0) {
    do {
      ::std::__cxx11::string::string((string *)&local_88,(this->config).HORIZONTAL,&local_8b);
      (*ss->_vptr_BaseResultRenderer[2])(ss,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  ::std::__cxx11::string::string((string *)&local_88,(this->config).RDCORNER,&local_8b);
  (*ss->_vptr_BaseResultRenderer[2])(ss,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  BaseResultRenderer::operator<<(ss,'\n');
  return;
}

Assistant:

void BoxRenderer::RenderRowCount(string row_count_str, string shown_str, const string &column_count_str,
                                 const vector<idx_t> &boundaries, bool has_hidden_rows, bool has_hidden_columns,
                                 idx_t total_length, idx_t row_count, idx_t column_count, idx_t minimum_row_length,
                                 BaseResultRenderer &ss) {
	// check if we can merge the row_count_str and the shown_str
	bool display_shown_separately = has_hidden_rows;
	if (has_hidden_rows && total_length >= row_count_str.size() + shown_str.size() + 5) {
		// we can!
		row_count_str += " " + shown_str;
		shown_str = string();
		display_shown_separately = false;
		minimum_row_length = row_count_str.size() + 4;
	}
	auto minimum_length = row_count_str.size() + column_count_str.size() + 6;
	bool render_rows_and_columns = total_length >= minimum_length &&
	                               ((has_hidden_columns && row_count > 0) || (row_count >= 10 && column_count > 1));
	bool render_rows = total_length >= minimum_row_length && (row_count == 0 || row_count >= 10);
	bool render_anything = true;
	if (!render_rows && !render_rows_and_columns) {
		render_anything = false;
	}
	// render the bottom of the result values, if there are any
	if (row_count > 0) {
		ss << (render_anything ? config.LMIDDLE : config.LDCORNER);
		idx_t column_index = 0;
		for (idx_t k = 0; k < total_length - 2; k++) {
			if (column_index + 1 < boundaries.size() && k == boundaries[column_index]) {
				ss << config.DMIDDLE;
				column_index++;
			} else {
				ss << config.HORIZONTAL;
			}
		}
		ss << (render_anything ? config.RMIDDLE : config.RDCORNER);
		ss << '\n';
	}
	if (!render_anything) {
		return;
	}

	if (render_rows_and_columns) {
		ss << config.VERTICAL;
		ss << " ";
		ss.Render(ResultRenderType::FOOTER, row_count_str);
		ss << string(total_length - row_count_str.size() - column_count_str.size() - 4, ' ');
		ss.Render(ResultRenderType::FOOTER, column_count_str);
		ss << " ";
		ss << config.VERTICAL;
		ss << '\n';
	} else if (render_rows) {
		RenderValue(ss, row_count_str, total_length - 4, ResultRenderType::FOOTER);
		ss << config.VERTICAL;
		ss << '\n';

		if (display_shown_separately) {
			RenderValue(ss, shown_str, total_length - 4, ResultRenderType::FOOTER);
			ss << config.VERTICAL;
			ss << '\n';
		}
	}
	// render the bottom line
	ss << config.LDCORNER;
	for (idx_t k = 0; k < total_length - 2; k++) {
		ss << config.HORIZONTAL;
	}
	ss << config.RDCORNER;
	ss << '\n';
}